

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O3

void Gia_ManFraSupports(Gia_ManFra_t *p)

{
  Gia_Man_t *pGVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  void **ppvVar7;
  void **__s;
  Vec_Int_t *p_00;
  Vec_Int_t *vSupp;
  int *piVar8;
  Vec_Int_t *vNodes;
  uint uVar9;
  long lVar10;
  size_t __n;
  int iVar11;
  
  iVar4 = p->pPars->nFrames;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar4 - 1U) {
    iVar11 = iVar4;
  }
  pVVar5->nCap = iVar11;
  lVar6 = (long)iVar11;
  if (iVar11 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc(lVar6 * 8);
  }
  pVVar5->pArray = ppvVar7;
  pVVar5->nSize = iVar4;
  __n = (long)iVar4 << 3;
  __s = (void **)0x0;
  memset(ppvVar7,0,__n);
  p->vIns = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = iVar11;
  if (iVar11 != 0) {
    __s = (void **)malloc(lVar6 * 8);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar4;
  ppvVar7 = (void **)0x0;
  memset(__s,0,__n);
  p->vAnds = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = iVar11;
  if (iVar11 != 0) {
    ppvVar7 = (void **)malloc(lVar6 << 3);
  }
  pVVar5->pArray = ppvVar7;
  pVVar5->nSize = iVar4;
  memset(ppvVar7,0,__n);
  p->vOuts = pVVar5;
  Gia_ManIncrementTravId(p->pAig);
  lVar6 = (long)p->pPars->nFrames;
  if (0 < lVar6) {
    vSupp = (Vec_Int_t *)0x0;
    do {
      p_00 = Gia_ManCollectPoIds(p->pAig);
      if (vSupp != (Vec_Int_t *)0x0) {
        iVar4 = vSupp->nSize;
        if (0 < iVar4) {
          lVar10 = 0;
          do {
            iVar11 = vSupp->pArray[lVar10];
            if ((long)iVar11 < 0) {
LAB_0074393f:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar1 = p->pAig;
            if (pGVar1->nObjs <= iVar11) goto LAB_0074393f;
            if (pGVar1->pObjs == (Gia_Obj_t *)0x0) break;
            uVar2 = *(undefined8 *)(pGVar1->pObjs + iVar11);
            if ((~(uint)uVar2 & 0x9fffffff) == 0) {
              uVar9 = (uint)((ulong)uVar2 >> 0x20) & 0x1fffffff;
              iVar11 = pGVar1->vCis->nSize;
              if (iVar11 - pGVar1->nRegs <= (int)uVar9) {
                iVar4 = pGVar1->vCos->nSize;
                uVar9 = (iVar4 - iVar11) + uVar9;
                if (((int)uVar9 < 0) || (iVar4 <= (int)uVar9)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar9 = pGVar1->vCos->pArray[uVar9];
                if (((int)uVar9 < 0) || ((uint)pGVar1->nObjs <= uVar9)) goto LAB_0074393f;
                Vec_IntPush(p_00,uVar9);
                iVar4 = vSupp->nSize;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar4);
        }
      }
      vSupp = (Vec_Int_t *)malloc(0x10);
      vSupp->nCap = 100;
      vSupp->nSize = 0;
      piVar8 = (int *)malloc(400);
      vSupp->pArray = piVar8;
      Gia_ManCollectCis(p->pAig,p_00->pArray,p_00->nSize,vSupp);
      vNodes = (Vec_Int_t *)malloc(0x10);
      vNodes->nCap = 100;
      vNodes->nSize = 0;
      piVar8 = (int *)malloc(400);
      vNodes->pArray = piVar8;
      Gia_ManCollectAnds(p->pAig,p_00->pArray,p_00->nSize,vNodes,(Vec_Int_t *)0x0);
      if (p->vIns->nSize < lVar6) {
LAB_0074395e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      lVar10 = lVar6 + -1;
      p->vIns->pArray[lVar10] = vSupp;
      if (p->vAnds->nSize < lVar6) goto LAB_0074395e;
      p->vAnds->pArray[lVar10] = vNodes;
      if (p->vOuts->nSize < lVar6) goto LAB_0074395e;
      p->vOuts->pArray[lVar10] = p_00;
      bVar3 = 1 < lVar6;
      lVar6 = lVar10;
    } while (bVar3);
  }
  return;
}

Assistant:

void Gia_ManFraSupports( Gia_ManFra_t * p )
{
    Vec_Int_t * vIns = NULL, * vAnds, * vOuts;
    Gia_Obj_t * pObj;
    int f, i;
    p->vIns  = Vec_PtrStart( p->pPars->nFrames );
    p->vAnds = Vec_PtrStart( p->pPars->nFrames );
    p->vOuts = Vec_PtrStart( p->pPars->nFrames );
    Gia_ManIncrementTravId( p->pAig );
    for ( f = p->pPars->nFrames - 1; f >= 0; f-- )
    {
        vOuts = Gia_ManCollectPoIds( p->pAig );
        if ( vIns )
        Gia_ManForEachObjVec( vIns, p->pAig, pObj, i )
            if ( Gia_ObjIsRo(p->pAig, pObj) )
                Vec_IntPush( vOuts, Gia_ObjId( p->pAig, Gia_ObjRoToRi(p->pAig, pObj) ) );
        vIns = Vec_IntAlloc( 100 );
        Gia_ManCollectCis( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vIns );
        vAnds = Vec_IntAlloc( 100 );
        Gia_ManCollectAnds( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vAnds, NULL );
        Vec_PtrWriteEntry( p->vIns,  f, vIns );
        Vec_PtrWriteEntry( p->vAnds, f, vAnds );
        Vec_PtrWriteEntry( p->vOuts, f, vOuts );
    }
}